

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

void __thiscall Fl_Value_Input_Type::ideal_size(Fl_Value_Input_Type *this,int *w,int *h)

{
  uint uVar1;
  Fl_Widget *pFVar2;
  int iVar3;
  int iVar4;
  double extraout_XMM0_Qa;
  
  pFVar2 = (this->super_Fl_Widget_Type).o;
  uVar1._0_1_ = pFVar2[2].type_;
  uVar1._1_1_ = pFVar2[2].damage_;
  uVar1._2_1_ = pFVar2[2].box_;
  uVar1._3_1_ = pFVar2[2].when_;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)uVar1,(ulong)*(uint *)&pFVar2[2].tooltip_);
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  *h = iVar3 + *(int *)&pFVar2[2].tooltip_ + -6;
  iVar3 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  *w = *w - iVar3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6d);
  iVar4 = *w + (int)extraout_XMM0_Qa + -1;
  iVar3 = Fl::box_dw((uint)((this->super_Fl_Widget_Type).o)->box_);
  *w = iVar3 + (iVar4 - iVar4 % (int)extraout_XMM0_Qa);
  if (*h < 0xf) {
    *h = 0xf;
  }
  if (*w < 0xf) {
    *w = 0xf;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Value_Input *myo = (Fl_Value_Input *)o;
    fl_font(myo->textfont(), myo->textsize());
    h = fl_height() + myo->textsize() - 6;
    w -= Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box());
    if (h < 15) h = 15;
    if (w < 15) w = 15;
  }